

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O1

int aom_compute_pyramid(YV12_BUFFER_CONFIG *frame,int bit_depth,int n_levels,ImagePyramid *pyr)

{
  uint8_t *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int out_stride;
  PyramidLayer *pPVar5;
  uint8_t *puVar6;
  int width;
  int height;
  _Bool _Var7;
  int iVar8;
  uint8_t *puVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  undefined4 uVar18;
  undefined1 auVar19 [16];
  
  pthread_mutex_lock((pthread_mutex_t *)pyr);
  iVar8 = pyr->filled_levels;
  if (pyr->max_levels < n_levels) {
    n_levels = pyr->max_levels;
  }
  if (iVar8 < n_levels) {
    if (iVar8 == 0) {
      uVar2 = (frame->field_2).field_0.y_crop_width;
      uVar3 = (frame->field_3).field_0.y_crop_height;
      uVar16 = (ulong)uVar3;
      iVar8 = (frame->field_4).field_0.y_stride;
      pPVar5 = pyr->layers;
      puVar9 = (frame->field_5).field_0.y_buffer;
      if ((frame->flags & 8) == 0) {
        pPVar5->buffer = puVar9;
        pPVar5->width = uVar2;
        pPVar5->height = uVar3;
        pPVar5->stride = iVar8;
        iVar8 = 1;
      }
      else {
        lVar11 = (long)(int)uVar2;
        puVar6 = pPVar5->buffer;
        iVar4 = pPVar5->stride;
        lVar10 = (long)iVar4;
        if (0 < (int)uVar3) {
          lVar15 = (long)puVar9 * 2;
          uVar12 = 0;
          puVar9 = puVar6;
          do {
            if (0 < (int)uVar2) {
              uVar13 = 0;
              do {
                puVar9[uVar13] =
                     (uint8_t)(*(ushort *)(lVar15 + uVar13 * 2) >> ((char)bit_depth - 8U & 0x1f));
                uVar13 = uVar13 + 1;
              } while (uVar2 != uVar13);
            }
            uVar12 = uVar12 + 1;
            puVar9 = puVar9 + lVar10;
            lVar15 = lVar15 + (long)iVar8 * 2;
          } while (uVar12 != uVar16);
          puVar9 = puVar6;
          if (0 < (int)uVar3) {
            do {
              auVar19 = ZEXT216(CONCAT11(*puVar9,*puVar9));
              auVar19 = pshuflw(auVar19,auVar19,0);
              uVar18 = auVar19._0_4_;
              *(undefined4 *)(puVar9 + -0x10) = uVar18;
              *(undefined4 *)(puVar9 + -0xc) = uVar18;
              *(undefined4 *)(puVar9 + -8) = uVar18;
              *(undefined4 *)(puVar9 + -4) = uVar18;
              auVar19 = ZEXT216(CONCAT11(puVar9[lVar11 + -1],puVar9[lVar11 + -1]));
              auVar19 = pshuflw(auVar19,auVar19,0);
              uVar18 = auVar19._0_4_;
              puVar1 = puVar9 + lVar11;
              *(undefined4 *)puVar1 = uVar18;
              *(undefined4 *)(puVar1 + 4) = uVar18;
              *(undefined4 *)(puVar1 + 8) = uVar18;
              *(undefined4 *)(puVar1 + 0xc) = uVar18;
              uVar16 = uVar16 - 1;
              puVar9 = puVar9 + lVar10;
            } while (uVar16 != 0);
          }
        }
        lVar15 = (long)(int)uVar3;
        puVar9 = puVar6 + lVar10 * -0x10 + -0x10;
        lVar17 = 0x10;
        do {
          memcpy(puVar9,puVar6 + -0x10,lVar11 + 0x20U);
          puVar9 = puVar9 + lVar10;
          lVar17 = lVar17 + -1;
        } while (lVar17 != 0);
        lVar17 = lVar15 + -1;
        puVar9 = puVar6 + lVar15 * lVar10 + -0x10;
        do {
          memcpy(puVar9,puVar6 + (long)(int)((uVar3 - 1) * iVar4) + -0x10,lVar11 + 0x20U);
          lVar17 = lVar17 + 1;
          puVar9 = puVar9 + lVar10;
        } while (lVar17 < lVar15 + 0xf);
        iVar8 = 1;
      }
    }
    if (iVar8 < n_levels) {
      lVar10 = (long)iVar8;
      do {
        pPVar5 = pyr->layers;
        puVar9 = pPVar5[lVar10 + -1].buffer;
        iVar8 = pPVar5[lVar10 + -1].stride;
        puVar6 = pPVar5[lVar10].buffer;
        iVar4 = pPVar5[lVar10].width;
        lVar17 = (long)iVar4;
        uVar2 = pPVar5[lVar10].height;
        uVar16 = (ulong)uVar2;
        lVar11 = (long)(int)uVar2;
        out_stride = pPVar5[lVar10].stride;
        lVar15 = (long)out_stride;
        width = iVar4 * 2;
        height = uVar2 * 2;
        _Var7 = should_resize_by_half(height,width,uVar2,iVar4);
        if (_Var7) {
          _Var7 = av1_resize_plane_to_half(puVar9,height,width,iVar8,puVar6,uVar2,iVar4,out_stride);
        }
        else {
          _Var7 = av1_resize_plane(puVar9,height,width,iVar8,puVar6,uVar2,iVar4,out_stride);
        }
        if (_Var7 == false) {
          pyr->filled_levels = n_levels;
        }
        else {
          puVar9 = puVar6;
          if (0 < (int)uVar2) {
            do {
              auVar19 = ZEXT216(CONCAT11(*puVar9,*puVar9));
              auVar19 = pshuflw(auVar19,auVar19,0);
              uVar18 = auVar19._0_4_;
              *(undefined4 *)(puVar9 + -0x10) = uVar18;
              *(undefined4 *)(puVar9 + -0xc) = uVar18;
              *(undefined4 *)(puVar9 + -8) = uVar18;
              *(undefined4 *)(puVar9 + -4) = uVar18;
              auVar19 = ZEXT216(CONCAT11(puVar9[lVar17 + -1],puVar9[lVar17 + -1]));
              auVar19 = pshuflw(auVar19,auVar19,0);
              uVar18 = auVar19._0_4_;
              puVar1 = puVar9 + lVar17;
              *(undefined4 *)puVar1 = uVar18;
              *(undefined4 *)(puVar1 + 4) = uVar18;
              *(undefined4 *)(puVar1 + 8) = uVar18;
              *(undefined4 *)(puVar1 + 0xc) = uVar18;
              puVar9 = puVar9 + lVar15;
              uVar16 = uVar16 - 1;
            } while (uVar16 != 0);
          }
          puVar9 = puVar6 + -0x10 + lVar15 * -0x10;
          lVar14 = 0x10;
          do {
            memcpy(puVar9,puVar6 + -0x10,lVar17 + 0x20U);
            puVar9 = puVar9 + lVar15;
            lVar14 = lVar14 + -1;
          } while (lVar14 != 0);
          lVar14 = lVar11 + -1;
          puVar9 = puVar6 + lVar11 * lVar15 + -0x10;
          do {
            memcpy(puVar9,puVar6 + (long)(int)((uVar2 - 1) * out_stride) + -0x10,lVar17 + 0x20U);
            lVar14 = lVar14 + 1;
            puVar9 = puVar9 + lVar15;
          } while (lVar14 < lVar11 + 0xf);
        }
        if (_Var7 == false) {
          n_levels = -1;
          goto LAB_0029d842;
        }
        lVar10 = lVar10 + 1;
      } while (n_levels != (int)lVar10);
    }
    pyr->filled_levels = n_levels;
  }
LAB_0029d842:
  pthread_mutex_unlock((pthread_mutex_t *)pyr);
  return n_levels;
}

Assistant:

int aom_compute_pyramid(const YV12_BUFFER_CONFIG *frame, int bit_depth,
                        int n_levels, ImagePyramid *pyr) {
  assert(pyr);

  // Per the comments in the ImagePyramid struct, we must take this mutex
  // before reading or writing the filled_levels field, and hold it while
  // computing any additional pyramid levels, to ensure proper behaviour
  // when multithreading is used
#if CONFIG_MULTITHREAD
  pthread_mutex_lock(&pyr->mutex);
#endif  // CONFIG_MULTITHREAD

  n_levels = AOMMIN(n_levels, pyr->max_levels);
  int result = n_levels;
  if (pyr->filled_levels < n_levels) {
    // Compute any missing levels that we need
    result = fill_pyramid(frame, bit_depth, n_levels, pyr);
  }

  // At this point, as long as result >= 0, the requested number of pyramid
  // levels are guaranteed to be valid, and can be safely read from without
  // holding the mutex any further
  assert(IMPLIES(result >= 0, pyr->filled_levels >= n_levels));
#if CONFIG_MULTITHREAD
  pthread_mutex_unlock(&pyr->mutex);
#endif  // CONFIG_MULTITHREAD
  return result;
}